

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImgIOException::CImgIOException(CImgIOException *this,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  FILE *__stream;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  CImgException *anon_var_0;
  int local_5c;
  undefined4 local_58;
  int size;
  va_list ap2;
  undefined4 local_38;
  undefined4 local_34;
  va_list ap;
  char *format_local;
  CImgIOException *this_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  CImgException::CImgException(&this->super_CImgException);
  *(undefined ***)&this->super_CImgException = &PTR__CImgIOException_003c49a8;
  ap[0].overflow_arg_area = local_128;
  ap[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  ap2[0].overflow_arg_area = local_128;
  ap2[0]._0_8_ = &stack0x00000008;
  size = 0x30;
  local_58 = 0x10;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_58);
  local_5c = iVar1 + 1;
  if (-1 < iVar1) {
    pcVar2 = (this->super_CImgException)._message;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    uVar4 = (ulong)local_5c;
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pcVar2 = (char *)operator_new__(uVar4);
    (this->super_CImgException)._message = pcVar2;
    vsnprintf((this->super_CImgException)._message,(long)local_5c,format,&local_38);
    puVar3 = cimg::exception_mode();
    if (*puVar3 != 0) {
      __stream = (FILE *)cimg::output((FILE *)0x0);
      fprintf(__stream,"\n%s[CImg] *** %s ***%s %s\n",&cimg::t_normal,"CImgIOException",
              &cimg::t_normal,(this->super_CImgException)._message);
      puVar3 = cimg::exception_mode();
      if ((*puVar3 & 1) == 0) {
        cimg::dialog("CImgIOException",(this->super_CImgException)._message,"Abort",(char *)0x0,
                     (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,false);
      }
      puVar3 = cimg::exception_mode();
      if (2 < *puVar3) {
        cimg::info();
      }
    }
  }
  return;
}

Assistant:

CImgIOException(const char *const format, ...) { _cimg_exception_err("CImgIOException",true); }